

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

visplane_t *
swrenderer::R_FindPlane
          (secplane_t *height,FTextureID picnum,int lightlevel,double Alpha,bool additive,
          FTransform *xxform,int sky,FSectorPortal *portal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  undefined8 uVar5;
  bool bVar6;
  visplane_t *pvVar7;
  ulong uVar8;
  uint hash;
  ulong uVar9;
  int local_cc;
  bool local_c8;
  uint local_c4;
  FTransform *local_c0;
  int local_b8;
  DAngle *local_a8;
  DAngle *local_a0;
  secplane_t local_98;
  FTransform local_68;
  
  local_b8 = SUB84(Alpha + 103079215104.0,0);
  local_c4 = sky;
  if (skyflatnum.texnum == picnum.texnum) {
    local_a8 = &local_68.Angle;
    local_a0 = &local_68.baseAngle;
    local_68.xOffs = 0.0;
    local_68.yOffs = 0.0;
    local_68.baseyOffs = 0.0;
    local_68.xScale = 1.0;
    local_68.yScale = 1.0;
    local_68.Angle.Degrees = 0.0;
    local_68.baseAngle.Degrees = 0.0;
    local_98.normal.Z = (height->normal).Z;
    local_98.normal.X = 0.0;
    local_98.normal.Y = 0.0;
    local_98.D = 0.0;
    local_98.negiC = -1.0 / local_98.normal.Z;
    if (portal == (FSectorPortal *)0x0) {
      portal = (FSectorPortal *)0x0;
    }
    else {
      local_c0 = &local_68;
      local_cc = 0;
      if ((portal->mFlags & 2) == 0) {
        hash = 0x80;
        bVar4 = true;
        local_c8 = false;
        goto LAB_00308bd3;
      }
    }
    local_cc = 0;
    xxform = &local_68;
    local_c8 = false;
  }
  else {
    local_a8 = &xxform->Angle;
    local_a0 = &xxform->baseAngle;
    local_cc = lightlevel;
    local_c8 = additive;
    if ((portal != (FSectorPortal *)0x0) && ((portal->mFlags & 2) == 0)) {
      local_98.normal.Z = (height->normal).Z;
      local_98.normal.X = (height->normal).X;
      local_98.normal.Y = (height->normal).Y;
      local_98.D = height->D;
      local_98.negiC = height->negiC;
      hash = 0x80;
      bVar4 = true;
      local_c0 = xxform;
      goto LAB_00308bd3;
    }
    local_98.normal.Z = (height->normal).Z;
    local_98.normal.X = (height->normal).X;
    local_98.normal.Y = (height->normal).Y;
    local_98.D = height->D;
    local_98.negiC = height->negiC;
    portal = (FSectorPortal *)0x0;
    sky = fakeAlpha | 0x80000000;
    if (((byte)fake3D & 3) == 0) {
      sky = 0;
    }
    local_b8 = 0x10000;
  }
  hash = SUB84(height->D + 103079215104.0,0) * 7 + picnum.texnum * 3 + local_cc & 0x7f;
  bVar4 = false;
  local_c4 = sky;
  local_c0 = xxform;
LAB_00308bd3:
  pvVar7 = (visplane_t *)(&visplanes + hash);
  do {
    do {
      do {
        do {
          while( true ) {
            pvVar7 = pvVar7->next;
            if (pvVar7 == (visplane_t *)0x0) {
              pvVar7 = new_visplane(hash);
              (pvVar7->height).normal.Z = local_98.normal.Z;
              (pvVar7->height).normal.X = local_98.normal.X;
              (pvVar7->height).normal.Y = local_98.normal.Y;
              (pvVar7->height).D = local_98.D;
              (pvVar7->height).negiC = local_98.negiC;
              (pvVar7->picnum).texnum = picnum.texnum;
              pvVar7->lightlevel = local_cc;
              (pvVar7->xform).yScale = local_c0->yScale;
              dVar1 = local_c0->xOffs;
              dVar2 = local_c0->yOffs;
              dVar3 = local_c0->xScale;
              (pvVar7->xform).baseyOffs = local_c0->baseyOffs;
              (pvVar7->xform).xScale = dVar3;
              (pvVar7->xform).xOffs = dVar1;
              (pvVar7->xform).yOffs = dVar2;
              (pvVar7->xform).Angle.Degrees = local_a8->Degrees;
              (pvVar7->xform).baseAngle.Degrees = local_a0->Degrees;
              pvVar7->colormap = basecolormap;
              pvVar7->sky = local_c4;
              pvVar7->portal = portal;
              uVar8 = (ulong)(uint)viewwidth;
              pvVar7->left = viewwidth;
              pvVar7->right = 0;
              pvVar7->extralight = stacked_extralight;
              pvVar7->visibility = stacked_visibility;
              (pvVar7->viewpos).Z = (double)stacked_viewpos._16_8_;
              uVar5 = stacked_viewpos._8_8_;
              (pvVar7->viewpos).X = (double)stacked_viewpos._0_8_;
              (pvVar7->viewpos).Y = (double)uVar5;
              (pvVar7->viewangle).Degrees = stacked_angle;
              pvVar7->Alpha = local_b8;
              pvVar7->Additive = local_c8;
              pvVar7->CurrentPortalUniq = CurrentPortalUniq;
              pvVar7->MirrorFlags = (uint)_MirrorFlags;
              pvVar7->CurrentSkybox = CurrentSkybox;
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                *(undefined2 *)(&pvVar7->field_0xda + uVar9 * 2) = 0x7fff;
              }
              return pvVar7;
            }
            if (bVar4) break;
            bVar6 = secplane_t::operator==(&local_98,&pvVar7->height);
            if (((((((bVar6) && ((pvVar7->picnum).texnum == picnum.texnum)) &&
                   (local_cc == pvVar7->lightlevel)) &&
                  ((basecolormap == pvVar7->colormap &&
                   (bVar6 = FTransform::operator==(local_c0,&pvVar7->xform), bVar6)))) &&
                 ((local_c4 == pvVar7->sky &&
                  ((CurrentPortalUniq == pvVar7->CurrentPortalUniq &&
                   (pvVar7->MirrorFlags == (uint)_MirrorFlags)))))) &&
                (CurrentSkybox == pvVar7->CurrentSkybox)) &&
               (bVar6 = TVector3<double>::operator==(&ViewPos,&pvVar7->viewpos), bVar6)) {
              return pvVar7;
            }
          }
        } while (portal != pvVar7->portal);
        bVar6 = secplane_t::operator==(&local_98,&pvVar7->height);
      } while (!bVar6);
      if (portal->mType == 0) {
        return pvVar7;
      }
    } while (((pvVar7->extralight != stacked_extralight) ||
             (pvVar7->visibility != stacked_visibility)) ||
            (bVar6 = TVector3<double>::operator==
                               (&pvVar7->viewpos,(TVector3<double> *)stacked_viewpos), !bVar6));
    if (portal->mType != 1) {
      return pvVar7;
    }
  } while ((((pvVar7->Alpha != local_b8) || (pvVar7->Additive != local_c8)) ||
           ((local_b8 != 0 &&
            (((bVar6 = secplane_t::operator==(&local_98,&pvVar7->height), !bVar6 ||
              ((pvVar7->picnum).texnum != picnum.texnum)) ||
             ((local_cc != pvVar7->lightlevel ||
              ((basecolormap != pvVar7->colormap ||
               (bVar6 = FTransform::operator==(local_c0,&pvVar7->xform), !bVar6)))))))))) ||
          ((pvVar7->viewangle).Degrees != stacked_angle));
  return pvVar7;
}

Assistant:

visplane_t *R_FindPlane (const secplane_t &height, FTextureID picnum, int lightlevel, double Alpha, bool additive,
						const FTransform &xxform,
						 int sky, FSectorPortal *portal)
{
	secplane_t plane;
	visplane_t *check;
	unsigned hash;						// killough
	bool isskybox;
	const FTransform *xform = &xxform;
	fixed_t alpha = FLOAT2FIXED(Alpha);
	//angle_t angle = (xform.Angle + xform.baseAngle).BAMs();

	FTransform nulltransform;

	if (picnum == skyflatnum)	// killough 10/98
	{ // most skies map together
		lightlevel = 0;
		xform = &nulltransform;
		nulltransform.xOffs = nulltransform.yOffs = nulltransform.baseyOffs = 0;
		nulltransform.xScale = nulltransform.yScale = 1;
		nulltransform.Angle = nulltransform.baseAngle = 0.0;
		additive = false;
		// [RH] Map floor skies and ceiling skies to separate visplanes. This isn't
		// always necessary, but it is needed if a floor and ceiling sky are in the
		// same column but separated by a wall. If they both try to reside in the
		// same visplane, then only the floor sky will be drawn.
		plane.set(0., 0., height.fC(), 0.);
		isskybox = portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX);
	}
	else if (portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX))
	{
		plane = height;
		isskybox = true;
	}
	else
	{
		plane = height;
		isskybox = false;
		// kg3D - hack, store alpha in sky
		// i know there is ->alpha, but this also allows to identify fake plane
		// and ->alpha is for stacked sectors
		if (fake3D & (FAKE3D_FAKEFLOOR|FAKE3D_FAKECEILING)) sky = 0x80000000 | fakeAlpha;
		else sky = 0;	// not skyflatnum so it can't be a sky
		portal = NULL;
		alpha = OPAQUE;
	}

	// New visplane algorithm uses hash table -- killough
	hash = isskybox ? MAXVISPLANES : visplane_hash (picnum.GetIndex(), lightlevel, height);

	for (check = visplanes[hash]; check; check = check->next)	// killough
	{
		if (isskybox)
		{
			if (portal == check->portal && plane == check->height)
			{
				if (portal->mType != PORTS_SKYVIEWPOINT)
				{ // This skybox is really a stacked sector, so we need to
				  // check even more.
					if (check->extralight == stacked_extralight &&
						check->visibility == stacked_visibility &&
						check->viewpos == stacked_viewpos &&
						(
							// headache inducing logic... :(
							(portal->mType != PORTS_STACKEDSECTORTHING) ||
							(
								check->Alpha == alpha &&
								check->Additive == additive &&
								(alpha == 0 ||	// if alpha is > 0 everything needs to be checked
									(plane == check->height &&
									 picnum == check->picnum &&
									 lightlevel == check->lightlevel &&
									 basecolormap == check->colormap &&	// [RH] Add more checks
									 *xform == check->xform
									)
								) &&
								check->viewangle == stacked_angle
							)
						)
					   )
					{
						return check;
					}
				}
				else
				{
					return check;
				}
			}
		}
		else
		if (plane == check->height &&
			picnum == check->picnum &&
			lightlevel == check->lightlevel &&
			basecolormap == check->colormap &&	// [RH] Add more checks
			*xform == check->xform &&
			sky == check->sky &&
			CurrentPortalUniq == check->CurrentPortalUniq &&
			MirrorFlags == check->MirrorFlags &&
			CurrentSkybox == check->CurrentSkybox &&
			ViewPos == check->viewpos
			)
		{
		  return check;
		}
	}

	check = new_visplane (hash);		// killough

	check->height = plane;
	check->picnum = picnum;
	check->lightlevel = lightlevel;
	check->xform = *xform;
	check->colormap = basecolormap;		// [RH] Save colormap
	check->sky = sky;
	check->portal = portal;
	check->left = viewwidth;			// Was SCREENWIDTH -- killough 11/98
	check->right = 0;
	check->extralight = stacked_extralight;
	check->visibility = stacked_visibility;
	check->viewpos = stacked_viewpos;
	check->viewangle = stacked_angle;
	check->Alpha = alpha;
	check->Additive = additive;
	check->CurrentPortalUniq = CurrentPortalUniq;
	check->MirrorFlags = MirrorFlags;
	check->CurrentSkybox = CurrentSkybox;

	fillshort (check->top, viewwidth, 0x7fff);

	return check;
}